

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumeralMultiplicationGeneralizationImpl.hpp
# Opt level: O1

Result Inferences::NumeralMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
  *this;
  uint uVar1;
  mp_limb_t *pmVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  Clause *cl_00;
  Entry *pEVar8;
  uint code_1;
  uint uVar9;
  Entry *pEVar10;
  undefined7 in_register_00000031;
  char *pcVar11;
  uint code;
  ulong uVar12;
  long lVar13;
  Entry *pEVar14;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar15;
  IntegerConstantType *pIVar16;
  RealConstantType *pRVar17;
  anon_class_16_2_f84bbffd f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_f84bbffd f_01;
  Result RVar18;
  Option<Kernel::Variable> var;
  NumeralMap numerals;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> monom_1;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  numeral_1;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> factor;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  numeral;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> factor_1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> monom;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  num;
  StlIter __begin2;
  char local_2f0;
  MaybeUninit<Kernel::Variable> local_2ec;
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  local_2e8;
  ulong local_2c8;
  long local_2c0;
  undefined1 local_2b8 [40];
  ulong local_290;
  undefined1 local_288 [32];
  int local_268;
  mp_limb_t *local_260;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_258;
  RationalConstantType local_228;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_208;
  Clause *local_1e0;
  undefined4 local_1d4;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_1d0;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_1a8;
  FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
  local_180;
  __mpz_struct local_158;
  undefined8 local_148;
  int local_140;
  undefined1 local_130 [40];
  undefined1 local_108 [2];
  undefined1 auStack_106 [16];
  IntegerConstantType local_f6;
  undefined1 local_e0;
  OptionBase<Kernel::PolyNf::SubtermIter> local_c0;
  StlIter local_80;
  MaybeUninit<Kernel::Variable> local_5c;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
  local_58;
  undefined1 local_34;
  
  local_1d4 = (undefined4)CONCAT71(in_register_00000031,doOrderingCheck);
  local_2e8._capacity = 0;
  local_2e8._noOfEntries = 0;
  local_2e8._entries = (Entry *)0x0;
  ::Lib::
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  ::expand(&local_2e8);
  local_1e0 = cl;
  Inferences::anon_class_1_0_00000001::operator()
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
              *)local_108,(anon_class_1_0_00000001 *)cl,cl_00);
  local_80._iter.
  super_OptionBase<Lib::IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>_&>
  .
  super_OptionBaseRef<Lib::IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>_*>
  ._elem = (OptionBase<Lib::IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>_&>
            )(OptionBase<Lib::IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>_&>
              )local_108;
  ::Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
  ::tryNext(&local_80._cur,
            (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
             *)local_108);
  while (local_80._cur.super_OptionBase<Kernel::AnyPoly>._isSome != false) {
    local_2c0 = local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_;
    if ((local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ & 3) == 1) {
      pIVar16 = *(IntegerConstantType **)
                 (local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 8);
      lVar13 = *(long *)(local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 0x10) -
               (long)pIVar16;
      if (pIVar16 != (IntegerConstantType *)0x0 && lVar13 != 0) {
        local_2c8 = (lVar13 >> 4) * -0x5555555555555555;
        uVar12 = 1;
        do {
          Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)local_288,pIVar16)
          ;
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)(local_288 + 0x10),pIVar16 + 1);
          local_268 = pIVar16[2]._val[0]._mp_alloc;
          pmVar2 = pIVar16[2]._val[0]._mp_d;
          pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)pmVar2[1];
          lVar13 = pmVar2[2] - (long)pDVar15;
          local_290 = uVar12;
          local_260 = pmVar2;
          if (pDVar15 !=
              (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)0x0 && lVar13 != 0) {
            uVar12 = 1;
            do {
              local_158._mp_d = (mp_limb_t *)0x0;
              local_148 = 0;
              local_158._0_8_ =
                   (ulong)*(byte *)&(pDVar15->
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    ).
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   & 0xffffffffffffff03;
              f_00.other = pDVar15;
              f_00.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)&local_158;
              ::Lib::CoproductImpl::
              RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                          *)&local_158,f_00);
              local_140 = *(int *)&pDVar15[1].
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ;
              Kernel::PolyNf::tryVar((PolyNf *)&local_158);
              if (local_2f0 == '\x01') {
                AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                          ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                            *)local_130,(Numeral<RatTraits> *)local_288);
                FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                ::FlatMeetLattice(&local_258,
                                  (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                   *)local_130);
                ::Lib::CoproductImpl::TrivialOperations::Destr::
                DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                *)local_130);
                if (local_140 == 1) {
                  Kernel::IntegerConstantType::IntegerConstantType
                            (&local_228._num,(IntegerConstantType *)local_288);
                  Kernel::IntegerConstantType::IntegerConstantType
                            (&local_228._den,(IntegerConstantType *)(local_288 + 0x10));
                  bVar5 = canDivideBy(&local_228);
                  mpz_clear(local_228._den._val);
                  mpz_clear((__mpz_struct *)&local_228);
                }
                else {
                  bVar5 = false;
                }
                if (bVar5 == false) {
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[7] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[8] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[9] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[10] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xb] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xc] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xd] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xe] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xf] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x10] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x11] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x12] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x13] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x14] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x15] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x16] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x17] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x18] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x19] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1a] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1b] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1c] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1d] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1e] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1f] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x20] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x21] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x22] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x23] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._37_3_ = 0;
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._0_8_ = 1;
                  ::Lib::
                  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                  ::replaceOrInsert(&local_2e8,(Variable)local_2ec.__align,&local_208);
                  if ((local_208._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_8_ & 1) == 0) {
                    pcVar11 = local_208._inner._inner.
                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                              .
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                              .
                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                              ._content;
                    goto LAB_0049ad86;
                  }
                }
                else {
                  if (local_2e8._maxEntries <= local_2e8._noOfEntries) {
                    ::Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::expand(&local_2e8);
                  }
                  uVar9 = (int)local_2ec + (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                  uVar3 = (ulong)uVar9 % (local_2e8._0_8_ & 0xffffffff);
                  pEVar8 = local_2e8._entries + uVar3;
                  uVar1 = local_2e8._entries[uVar3].code;
                  while (uVar1 != 0) {
                    if ((uVar1 == uVar9) && (pEVar8->_key == local_2ec)) {
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&local_1a8,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar8->_value).__align);
                      ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)local_2b8,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)&local_258);
                      FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                      ::meet(&local_180,&local_1a8,
                             (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                              *)local_2b8);
                      if ((local_2b8[0] & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)(local_2b8 + 1));
                      }
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar8->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&local_180);
                      if ((local_180._inner._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                           .
                           super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           ._0_1_ & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)((long)&local_180._inner._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                          + 1));
                      }
                      if ((local_1a8._inner._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                           .
                           super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           ._0_1_ & 1) != 0) goto LAB_0049ad8b;
                      pcVar11 = (char *)((long)&local_1a8._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_0049ad86;
                    }
                    pEVar8 = pEVar8 + 1;
                    if (pEVar8 == local_2e8._afterLast) {
                      pEVar8 = local_2e8._entries;
                    }
                    uVar1 = pEVar8->code;
                  }
                  local_2e8._noOfEntries = local_2e8._noOfEntries + 1;
                  ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_1d0,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_258);
                  (pEVar8->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                  ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&(pEVar8->_value).__align,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&local_1d0);
                  pEVar8->code = uVar9;
                  if ((local_1d0._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_1_ & 1) == 0) {
                    pcVar11 = (char *)((long)&local_1d0._inner._inner.
                                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                              .
                                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                              .
                                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      + 1);
LAB_0049ad86:
                    ::Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)pcVar11);
                  }
                }
LAB_0049ad8b:
                if ((local_258._inner._inner.
                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                     .
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                     .
                     super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                     ._0_8_ & 1) == 0) {
                  ::Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)local_258._inner._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                    .
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                    .
                                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                    ._content);
                }
              }
              if (uVar12 < (ulong)((lVar13 >> 2) * 0x6db6db6db6db6db7)) {
                lVar4 = uVar12 * 0x1c;
                uVar12 = uVar12 + 1;
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)(lVar4 + pmVar2[1]);
              }
              else {
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)0x0;
              }
            } while (pDVar15 !=
                     (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)0x0);
          }
          mpz_clear((__mpz_struct *)(local_288 + 0x10));
          mpz_clear((__mpz_struct *)local_288);
          if (local_290 < local_2c8) {
            pIVar16 = (IntegerConstantType *)(local_290 * 0x30 + *(long *)(local_2c0 + 8));
            uVar12 = local_290 + 1;
          }
          else {
            pIVar16 = (IntegerConstantType *)0x0;
            uVar12 = local_290;
          }
        } while (pIVar16 != (IntegerConstantType *)0x0);
      }
    }
    else if ((local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ & 3) == 0) {
      pIVar16 = *(IntegerConstantType **)
                 (local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 8);
      local_2c8 = *(long *)(local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 0x10
                           ) - (long)pIVar16;
      if (pIVar16 != (IntegerConstantType *)0x0 && local_2c8 != 0) {
        local_2c8 = (long)local_2c8 >> 5;
        uVar12 = 1;
        do {
          Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)local_130,pIVar16)
          ;
          local_130._16_4_ = pIVar16[1]._val[0]._mp_alloc;
          pmVar2 = pIVar16[1]._val[0]._mp_d;
          pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)pmVar2[1];
          lVar13 = pmVar2[2] - (long)pDVar15;
          local_290 = uVar12;
          local_130._24_8_ = pmVar2;
          if (pDVar15 !=
              (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)0x0 && lVar13 != 0) {
            uVar12 = 1;
            do {
              local_228._num._val[0]._mp_d = (mp_limb_t *)0x0;
              local_228._den._val[0]._mp_alloc = 0;
              local_228._den._val[0]._mp_size = 0;
              local_228._num._val[0]._0_8_ =
                   (ulong)*(byte *)&(pDVar15->
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    ).
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   & 0xffffffffffffff03;
              f.other = pDVar15;
              f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                        *)&local_228;
              ::Lib::CoproductImpl::
              RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                          *)&local_228,f);
              local_228._den._val[0]._mp_d._0_4_ =
                   *(int *)&pDVar15[1].
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                            .
                            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ;
              Kernel::PolyNf::tryVar((PolyNf *)&local_228);
              if (local_2f0 == '\x01') {
                AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                          ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                            *)&local_208,(Numeral<IntTraits> *)local_130);
                FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                ::FlatMeetLattice(&local_1d0,
                                  (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                   *)&local_208);
                ::Lib::CoproductImpl::TrivialOperations::Destr::
                DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                *)&local_208);
                if ((int)local_228._den._val[0]._mp_d == 1) {
                  Kernel::IntegerConstantType::IntegerConstantType
                            ((IntegerConstantType *)&local_158,(IntegerConstantType *)local_130);
                  bVar5 = canDivideBy((IntegerConstantType *)&local_158);
                  mpz_clear(&local_158);
                }
                else {
                  bVar5 = false;
                }
                if (bVar5 == false) {
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[7] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[8] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[9] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[10] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xb] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xc] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xd] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xe] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xf] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x10] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x11] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x12] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x13] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x14] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x15] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x16] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x17] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x18] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x19] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1a] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1b] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1c] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1d] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1e] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1f] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x20] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x21] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x22] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x23] = '\0';
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._37_3_ = 0;
                  local_258._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._0_8_ = 1;
                  ::Lib::
                  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                  ::replaceOrInsert(&local_2e8,(Variable)local_2ec.__align,&local_258);
                  if ((local_258._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_8_ & 1) == 0) {
                    pcVar11 = local_258._inner._inner.
                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                              .
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                              .
                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                              ._content;
                    goto LAB_0049a9d2;
                  }
                }
                else {
                  if (local_2e8._maxEntries <= local_2e8._noOfEntries) {
                    ::Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::expand(&local_2e8);
                  }
                  uVar9 = (int)local_2ec + (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                  uVar3 = (ulong)uVar9 % (local_2e8._0_8_ & 0xffffffff);
                  pEVar8 = local_2e8._entries + uVar3;
                  uVar1 = local_2e8._entries[uVar3].code;
                  while (uVar1 != 0) {
                    if ((uVar1 == uVar9) && (pEVar8->_key == local_2ec)) {
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&local_180,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar8->_value).__align);
                      ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)local_288,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)&local_1d0);
                      FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                      ::meet((FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                              *)local_2b8,&local_180,
                             (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                              *)local_288);
                      if ((local_288[0] & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)(local_288 + 1));
                      }
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar8->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)local_2b8);
                      if ((local_2b8[0] & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)(local_2b8 + 1));
                      }
                      if ((local_180._inner._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                           .
                           super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           ._0_1_ & 1) != 0) goto LAB_0049a9d7;
                      pcVar11 = (char *)((long)&local_180._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_0049a9d2;
                    }
                    pEVar8 = pEVar8 + 1;
                    if (pEVar8 == local_2e8._afterLast) {
                      pEVar8 = local_2e8._entries;
                    }
                    uVar1 = pEVar8->code;
                  }
                  local_2e8._noOfEntries = local_2e8._noOfEntries + 1;
                  ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_1a8,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_1d0);
                  (pEVar8->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                  ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&(pEVar8->_value).__align,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&local_1a8);
                  pEVar8->code = uVar9;
                  if ((local_1a8._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_1_ & 1) == 0) {
                    pcVar11 = (char *)((long)&local_1a8._inner._inner.
                                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                              .
                                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                              .
                                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      + 1);
LAB_0049a9d2:
                    ::Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)pcVar11);
                  }
                }
LAB_0049a9d7:
                if ((local_1d0._inner._inner.
                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                     .
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                     .
                     super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                     ._0_1_ & 1) == 0) {
                  ::Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)((long)&local_1d0._inner._inner.
                                            super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                            .
                                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                            .
                                            super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                    + 1));
                }
              }
              if (uVar12 < (ulong)((lVar13 >> 2) * 0x6db6db6db6db6db7)) {
                lVar4 = uVar12 * 0x1c;
                uVar12 = uVar12 + 1;
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)(lVar4 + pmVar2[1]);
              }
              else {
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)0x0;
              }
            } while (pDVar15 !=
                     (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)0x0);
          }
          mpz_clear((__mpz_struct *)local_130);
          if (local_290 < local_2c8) {
            pIVar16 = (IntegerConstantType *)(local_290 * 0x20 + *(long *)(local_2c0 + 8));
            uVar12 = local_290 + 1;
          }
          else {
            pIVar16 = (IntegerConstantType *)0x0;
            uVar12 = local_290;
          }
        } while (pIVar16 != (IntegerConstantType *)0x0);
      }
    }
    else {
      pRVar17 = *(RealConstantType **)
                 (local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 8);
      lVar13 = *(long *)(local_80._cur.super_OptionBase<Kernel::AnyPoly>._elem._elem._9_8_ + 0x10) -
               (long)pRVar17;
      if (pRVar17 != (RealConstantType *)0x0 && lVar13 != 0) {
        local_2c8 = (lVar13 >> 4) * -0x5555555555555555;
        uVar12 = 1;
        do {
          Kernel::RealConstantType::RealConstantType((RealConstantType *)local_288,pRVar17);
          local_268 = pRVar17[1].super_RationalConstantType._num._val[0]._mp_alloc;
          pmVar2 = pRVar17[1].super_RationalConstantType._num._val[0]._mp_d;
          pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)pmVar2[1];
          lVar13 = pmVar2[2] - (long)pDVar15;
          local_290 = uVar12;
          local_260 = pmVar2;
          if (pDVar15 !=
              (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)0x0 && lVar13 != 0) {
            uVar12 = 1;
            do {
              local_158._mp_d = (mp_limb_t *)0x0;
              local_148 = 0;
              local_158._0_8_ =
                   (ulong)*(byte *)&(pDVar15->
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                    ).
                                    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                   & 0xffffffffffffff03;
              f_01.other = pDVar15;
              f_01.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)&local_158;
              ::Lib::CoproductImpl::
              RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                        ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                          *)&local_158,f_01);
              local_140 = *(int *)&pDVar15[1].
                                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                   .
                                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ;
              Kernel::PolyNf::tryVar((PolyNf *)&local_158);
              if (local_2f0 == '\x01') {
                AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>::AnyNumber
                          ((AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                            *)local_130,(Numeral<RealTraits> *)local_288);
                FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                ::FlatMeetLattice(&local_258,
                                  (AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>
                                   *)local_130);
                ::Lib::CoproductImpl::TrivialOperations::Destr::
                DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                *)local_130);
                if (local_140 == 1) {
                  Kernel::RealConstantType::RealConstantType
                            ((RealConstantType *)&local_228,(RealConstantType *)local_288);
                  bVar5 = canDivideBy((RealConstantType *)&local_228);
                  mpz_clear(local_228._den._val);
                  mpz_clear((__mpz_struct *)&local_228);
                }
                else {
                  bVar5 = false;
                }
                if (bVar5 == false) {
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[7] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[8] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[9] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[10] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xb] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xc] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xd] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xe] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0xf] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x10] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x11] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x12] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x13] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x14] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x15] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x16] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x17] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x18] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x19] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1a] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1b] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1c] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1d] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1e] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x1f] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x20] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x21] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x22] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._content[0x23] = '\0';
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._37_3_ = 0;
                  local_208._inner._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                  .
                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                  ._0_8_ = 1;
                  ::Lib::
                  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                  ::replaceOrInsert(&local_2e8,(Variable)local_2ec.__align,&local_208);
                  if ((local_208._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_8_ & 1) == 0) {
                    pcVar11 = local_208._inner._inner.
                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                              .
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                              .
                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                              ._content;
                    goto LAB_0049b124;
                  }
                }
                else {
                  if (local_2e8._maxEntries <= local_2e8._noOfEntries) {
                    ::Lib::
                    Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
                    ::expand(&local_2e8);
                  }
                  uVar9 = (int)local_2ec + (uint)(local_2ec == (MaybeUninit<Kernel::Variable>)0x0);
                  uVar3 = (ulong)uVar9 % (local_2e8._0_8_ & 0xffffffff);
                  pEVar8 = local_2e8._entries + uVar3;
                  uVar1 = local_2e8._entries[uVar3].code;
                  while (uVar1 != 0) {
                    if ((uVar1 == uVar9) && (pEVar8->_key == local_2ec)) {
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&local_1a8,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                     *)&(pEVar8->_value).__align);
                      ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)local_2b8,
                                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                     *)&local_258);
                      FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                      ::meet(&local_180,&local_1a8,
                             (FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>
                              *)local_2b8);
                      if ((local_2b8[0] & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)(local_2b8 + 1));
                      }
                      ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                      DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                      ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&(pEVar8->_value).__align,
                                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                   *)&local_180);
                      if ((local_180._inner._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                           .
                           super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           ._0_1_ & 1) == 0) {
                        ::Lib::CoproductImpl::TrivialOperations::Destr::
                        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                        *)((long)&local_180._inner._inner.
                                                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                  .
                                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                  .
                                                  super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                          + 1));
                      }
                      if ((local_1a8._inner._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                           .
                           super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                           ._0_1_ & 1) != 0) goto LAB_0049b129;
                      pcVar11 = (char *)((long)&local_1a8._inner._inner.
                                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                                .
                                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                                .
                                                super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                        + 1);
                      goto LAB_0049b124;
                    }
                    pEVar8 = pEVar8 + 1;
                    if (pEVar8 == local_2e8._afterLast) {
                      pEVar8 = local_2e8._entries;
                    }
                    uVar1 = pEVar8->code;
                  }
                  local_2e8._noOfEntries = local_2e8._noOfEntries + 1;
                  ::Lib::CoproductImpl::TrivialOperations::CopyCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_1d0,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                                 *)&local_258);
                  (pEVar8->_key).__align = (anon_struct_4_0_00000001_for___align)local_2ec;
                  ::Lib::CoproductImpl::TrivialOperations::MoveCons::
                  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&(pEVar8->_value).__align,
                                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                 *)&local_1d0);
                  pEVar8->code = uVar9;
                  if ((local_1d0._inner._inner.
                       super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                       .
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                       .
                       super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                       ._0_1_ & 1) == 0) {
                    pcVar11 = (char *)((long)&local_1d0._inner._inner.
                                              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                              .
                                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                              .
                                              super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                      + 1);
LAB_0049b124:
                    ::Lib::CoproductImpl::TrivialOperations::Destr::
                    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                    *)pcVar11);
                  }
                }
LAB_0049b129:
                if ((local_258._inner._inner.
                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                     .
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                     .
                     super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                     ._0_8_ & 1) == 0) {
                  ::Lib::CoproductImpl::TrivialOperations::Destr::
                  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                  ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                                  *)local_258._inner._inner.
                                    super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>
                                    .
                                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>
                                    .
                                    super_RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>
                                    ._content);
                }
              }
              if (uVar12 < (ulong)((lVar13 >> 2) * 0x6db6db6db6db6db7)) {
                lVar4 = uVar12 * 0x1c;
                uVar12 = uVar12 + 1;
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)(lVar4 + pmVar2[1]);
              }
              else {
                pDVar15 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                           *)0x0;
              }
            } while (pDVar15 !=
                     (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)0x0);
          }
          mpz_clear((__mpz_struct *)(local_288 + 0x10));
          uVar12 = local_290;
          mpz_clear((__mpz_struct *)local_288);
          if (uVar12 < local_2c8) {
            pRVar17 = (RealConstantType *)(uVar12 * 0x30 + *(long *)(local_2c0 + 8));
            uVar12 = uVar12 + 1;
          }
          else {
            pRVar17 = (RealConstantType *)0x0;
          }
        } while (pRVar17 != (RealConstantType *)0x0);
      }
    }
    ::Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::StlIter::operator++(&local_80);
  }
  ::Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_c0);
  bVar5 = local_2e8._entries != local_2e8._afterLast;
  pEVar8 = local_2e8._entries;
  if (bVar5) {
    bVar5 = true;
    uVar1 = (local_2e8._entries)->code;
    while (uVar1 == 0) {
      pEVar8 = pEVar8 + 1;
      bVar5 = pEVar8 != local_2e8._afterLast;
      if (pEVar8 == local_2e8._afterLast) break;
      uVar1 = pEVar8->code;
    }
  }
  if ((bool)(bVar5 ^ 1U | pEVar8 == (Entry *)0x0)) {
    pEVar10 = (Entry *)0x0;
  }
  else {
    pEVar14 = pEVar8 + 1;
    if (!bVar5) {
      pEVar14 = pEVar8;
    }
    pEVar10 = (Entry *)0x0;
    do {
      ::Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                     *)local_108,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>,_Inferences::Bot>_>_>_>
                     *)&(pEVar8->_value).__align);
      if (((uint)_local_108 & 1) == 0) {
        if ((local_108[1] & 3) == 1) {
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_2b8,(IntegerConstantType *)(local_108 + 2));
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)(local_2b8 + 0x10),&local_f6);
          Kernel::RationalConstantType::RationalConstantType((RationalConstantType *)local_288,1);
          bVar5 = Kernel::RationalConstantType::operator==
                            ((RationalConstantType *)local_288,(RationalConstantType *)local_2b8);
          mpz_clear((__mpz_struct *)(local_288 + 0x10));
          mpz_clear((__mpz_struct *)local_288);
          mpz_clear((__mpz_struct *)(local_2b8 + 0x10));
          mpz_clear((__mpz_struct *)local_2b8);
        }
        else if (((uint)_local_108 & 0x300) == 0) {
          Kernel::IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_2b8,(IntegerConstantType *)(local_108 + 2));
          Kernel::IntegerConstantType::IntegerConstantType((IntegerConstantType *)local_288,1);
          iVar6 = mpz_cmp((__mpz_struct *)local_288,(__mpz_struct *)local_2b8);
          mpz_clear((__mpz_struct *)local_288);
          mpz_clear((__mpz_struct *)local_2b8);
          bVar5 = iVar6 == 0;
        }
        else {
          Kernel::RealConstantType::RealConstantType
                    ((RealConstantType *)local_2b8,(RealConstantType *)(local_108 + 2));
          Kernel::RealConstantType::RealConstantType((RealConstantType *)local_288,1);
          bVar5 = Kernel::RationalConstantType::operator==
                            ((RationalConstantType *)local_288,(RationalConstantType *)local_2b8);
          mpz_clear((__mpz_struct *)(local_288 + 0x10));
          mpz_clear((__mpz_struct *)local_288);
          mpz_clear((__mpz_struct *)(local_2b8 + 0x10));
          mpz_clear((__mpz_struct *)local_2b8);
        }
        if ((bVar5 == false) &&
           ((pEVar10 == (Entry *)0x0 || ((uint)pEVar8->_key < (uint)pEVar10->_key)))) {
          pEVar10 = pEVar8;
        }
      }
      if (((uint)_local_108 & 1) == 0) {
        ::Lib::CoproductImpl::TrivialOperations::Destr::
        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
        ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                        *)(local_108 + 1));
      }
      if (pEVar14 == local_2e8._afterLast) {
LAB_0049b474:
        pEVar8 = (Entry *)0x0;
      }
      else {
        uVar1 = pEVar14->code;
        pEVar8 = pEVar14;
        while (uVar1 == 0) {
          pEVar14 = pEVar8 + 1;
          if (pEVar14 == local_2e8._afterLast) goto LAB_0049b474;
          pEVar8 = pEVar14;
          uVar1 = pEVar14->code;
        }
        pEVar14 = pEVar8 + 1;
      }
    } while (pEVar8 != (Entry *)0x0);
  }
  if (pEVar10 == (Entry *)0x0) {
    uVar7 = 0;
  }
  else {
    _local_108 = pEVar10->_key;
    this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
            *)(auStack_106 + 2);
    ::Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
    ::DefaultImpl(this,(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
                        *)((long)&pEVar10->_value + 1));
    local_e0 = (undefined1)local_1d4;
    local_5c = _local_108;
    ::Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>_>_>
    ::DefaultImpl(&local_58,this);
    local_34 = local_e0;
    RVar18 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>>
                       (local_1e0,
                        (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize>
                         *)&local_5c.__align);
    local_1e0 = RVar18.simplified;
    uVar7 = RVar18._8_4_;
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    *)&local_58);
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType>_>
                    *)this);
  }
  ::Lib::
  Map<Kernel::Variable,_Inferences::FlatMeetLattice<Inferences::AnyNumber<Inferences::NumeralMultiplicationGeneralizationImpl::Numeral>_>,_Lib::StlHash>
  ::clear(&local_2e8);
  RVar18._8_4_ = uVar7;
  RVar18.simplified = local_1e0;
  RVar18._12_4_ = 0;
  return RVar18;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);

  NumeralMap numerals;

  /* scan candidate numeral multiplications n * x  */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply([&](auto& poly) {
      for (auto monom : poly->iterSummands()) {
        for (auto factor : monom.factors->iter()) {
          
          auto var = factor.term.tryVar();
          if (var.isSome()) {
            auto numeral = FlatMeetLattice<AnyNumber<Numeral>>(AnyNumber<Numeral>(monom.numeral));

            if (factor.power == 1 && canDivideBy(monom.numeral)) {
              /* we found numeral * var */
              numerals.updateOrInit(var.unwrap(), 
                  /* update the numeral if there was already one associated with this variable */
                  [&](auto n) 
                  { return n.meet(numeral); },
                  /* init the numeral if there was none */
                  [&]() { return numeral; });
            } else {
              ASS_NEQ(factor.power, 0)
              /* x^n ==> we cannot generalize. hence we set the numeral for this variable to bottom. */
              numerals.replaceOrInsert(var.unwrap(), FlatMeetLattice<AnyNumber<Numeral>>::bot());
            }
          }
        }
      }
    });
  }

  /* select one of the variables we can generalize on */
  Option<typename NumeralMap::Entry &> selected;
  for (auto& e : iterTraits(numerals.iter()) ) {
    FlatMeetLattice<AnyNumber<Numeral>> num = e.value();
    if (!num.isBot() && !num.unwrap().apply(isOne)) {
      /* we use the entry with the least variable, in order to prevent non-determinism */
      if (selected.isNone() || e.key() < selected.unwrap().key()) {
        selected = decltype(selected)(e);
      }
    }
  }

  if (selected.isNone()) {
    DEBUG("not applicable")
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    auto& e = selected.unwrap();
    DEBUG("selected generalization: (", e.key(), ", ", e.value(), ")");
    Generalize gen { e.key(), e.value().unwrap(), doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}